

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O1

void __thiscall Js::StringProfiler::RecordNewString(StringProfiler *this,char16 *sz,uint length)

{
  BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  int iVar1;
  ThreadContextId pvVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  undefined1 local_38 [8];
  StringMetrics metrics;
  uint length_local;
  
  metrics.count8BitASCII = length;
  pvVar2 = JsUtil::ExternalApi::GetCurrentThreadContextId();
  if (pvVar2 == this->mainThreadId) {
    iVar1 = 0;
    if ((sz != (char16 *)0x0) && (iVar1 = 0, (ulong)metrics.count8BitASCII != 0)) {
      iVar5 = 0;
      lVar3 = 0;
      do {
        if (0x7f < (ushort)sz[lVar3]) {
          iVar5 = 1;
        }
        iVar1 = 2;
      } while (((ushort)sz[lVar3] < 0x100) &&
              (bVar6 = (ulong)metrics.count8BitASCII - 1 != lVar3, lVar3 = lVar3 + 1, iVar1 = iVar5,
              bVar6));
    }
    metrics.count7BitASCII = 0;
    local_38._0_4_ = 0;
    local_38._4_4_ = 0;
    this_00 = &this->stringLengthMetrics;
    bVar6 = JsUtil::
            BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>(this_00,&metrics.count8BitASCII,(StringMetrics *)local_38);
    if (bVar6) {
      if (iVar1 == 2) {
        metrics.count7BitASCII = metrics.count7BitASCII + 1;
      }
      else if (iVar1 == 1) {
        local_38._4_4_ = local_38._4_4_ + 1;
      }
      else {
        local_38._0_4_ = local_38._0_4_ + 1;
      }
      JsUtil::
      BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                ((BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this_00,&metrics.count8BitASCII,(StringMetrics *)local_38);
    }
    else {
      if (iVar1 == 2) {
        metrics.count7BitASCII = metrics.count7BitASCII + 1;
      }
      else if (iVar1 == 1) {
        local_38._4_4_ = local_38._4_4_ + 1;
      }
      else {
        local_38._0_4_ = local_38._0_4_ + 1;
      }
      JsUtil::
      BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this_00,&metrics.count8BitASCII,(StringMetrics *)local_38);
    }
    if (sz != (char16 *)0x0) {
      if ((ulong)metrics.count8BitASCII == 0) {
        iVar1 = 0;
      }
      else {
        uVar4 = 0;
        iVar1 = 0;
        do {
          iVar1 = iVar1 + (uint)(sz[uVar4] == L'\0');
          uVar4 = uVar4 + 1;
        } while (metrics.count8BitASCII != uVar4);
      }
      if (iVar1 != 0) {
        this->embeddedNULChars = this->embeddedNULChars + iVar1;
        this->embeddedNULStrings = this->embeddedNULStrings + 1;
      }
    }
  }
  else {
    LOCK();
    this->discardedWrongThread = this->discardedWrongThread + 1;
    UNLOCK();
  }
  return;
}

Assistant:

void StringProfiler::RecordNewString( const char16* sz, uint length )
    {
        if( IsOnWrongThread() )
        {
            ::InterlockedIncrement(&discardedWrongThread);
            return;
        }
        RequiredEncoding encoding = ASCII7bit;
        if(sz)
        {
            encoding = GetRequiredEncoding(sz, length);
        }

        StringMetrics metrics = {};

        if( stringLengthMetrics.TryGetValue(length, &metrics) )
        {
            metrics.Accumulate(encoding);
            stringLengthMetrics.Item(length,metrics);
        }
        else
        {
            metrics.Accumulate(encoding);
            stringLengthMetrics.Add(length,metrics);
        }

        if(sz)
        {
            uint embeddedNULs = CountEmbeddedNULs(sz, length);
            if( embeddedNULs != 0 )
            {

                this->embeddedNULChars += embeddedNULs;
                this->embeddedNULStrings++;
            }
        }
    }